

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O2

int __thiscall lzham::task_pool::init(task_pool *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  uint uVar3;
  uint uVar4;
  ulong uVar2;
  
  uVar3 = 0x10;
  if ((uint)ctx < 0x10) {
    uVar3 = (uint)ctx;
  }
  deinit(this);
  uVar4 = 0;
  uVar2 = extraout_RAX;
  do {
    this->m_num_threads = uVar4;
    if (uVar3 <= uVar4) {
LAB_0011292e:
      return (int)CONCAT71((int7)(uVar2 >> 8),uVar3 <= uVar4);
    }
    uVar1 = pthread_create(this->m_threads + uVar4,(pthread_attr_t *)0x0,thread_func,this);
    uVar2 = (ulong)uVar1;
    if (uVar1 != 0) {
      deinit(this);
      uVar2 = extraout_RAX_00;
      goto LAB_0011292e;
    }
    uVar4 = this->m_num_threads + 1;
  } while( true );
}

Assistant:

bool task_pool::init(uint num_threads)
   {
      LZHAM_ASSERT(num_threads <= cMaxThreads);
      num_threads = math::minimum<uint>(num_threads, cMaxThreads);

      deinit();

      bool succeeded = true;

      m_num_threads = 0;
      while (m_num_threads < num_threads)
      {
         int status = pthread_create(&m_threads[m_num_threads], NULL, thread_func, this);
         if (status)
         {
            succeeded = false;
            break;
         }

         m_num_threads++;
      }

      if (!succeeded)
      {
         deinit();
         return false;
      }

      return true;
   }